

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpus.c
# Opt level: O2

gboolean uc_exit_invalidate_iter(gpointer key,gpointer val,gpointer data)

{
  if (*key != 0) {
    (**(code **)((long)data + 0x160))(data,*key + -1,1);
  }
  return 0;
}

Assistant:

static inline gboolean uc_exit_invalidate_iter(gpointer key, gpointer val, gpointer data) 
{
    uint64_t exit = *((uint64_t*)key);
    uc_engine *uc = (uc_engine*)data;
    
    if (exit != 0) {
        // Unicorn: Why addr - 1?
        // 
        // 0: INC ecx
        // 1: DEC edx <--- We put exit here, then the range of TB is [0, 1)
        //
        // While tb_invalidate_phys_range invalides [start, end)
        //
        // This function is designed to used with g_tree_foreach
        uc->uc_invalidate_tb(uc, exit - 1, 1);
    }

    return false;
}